

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_ends_with(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  ushort uVar1;
  vm_datatype_t vVar2;
  int iVar3;
  ushort *puVar4;
  
  if ((getp_ends_with(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&getp_ends_with(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar3 != 0)) {
    getp_ends_with::desc.min_argc_ = 1;
    getp_ends_with::desc.opt_argc_ = 0;
    getp_ends_with::desc.varargs_ = 0;
    __cxa_guard_release(&getp_ends_with(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_ends_with::desc);
  if (iVar3 == 0) {
    puVar4 = (ushort *)CVmBif::pop_str_val();
    uVar1 = *puVar4;
    if ((*(ushort *)str < uVar1) ||
       (iVar3 = bcmp(str + ((ulong)*(ushort *)str - (ulong)uVar1) + 2,puVar4 + 1,(ulong)uVar1),
       iVar3 != 0)) {
      vVar2 = VM_NIL;
    }
    else {
      vVar2 = VM_TRUE;
    }
    retval->typ = vVar2;
    return 1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_ends_with(VMG_ vm_val_t *retval,
                                 const vm_val_t *self_val,
                                 const char *str, uint *argc)
{
    const char *str2;
    size_t len;
    size_t len2;

    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the other string */
    str2 = CVmBif::pop_str_val(vmg0_);

    /* get the lengths of the two strings */
    len = vmb_get_len(str);
    len2 = vmb_get_len(str2);

    /* move to the contents of each string */
    str += VMB_LEN;
    str2 += VMB_LEN;

    /* 
     *   If the other string is no longer than our string, and the other
     *   string matches our string at the end exactly for the other string's
     *   entire length, we start with the other string.  Note we don't need
     *   to worry about finding a valid character index in our string for
     *   the ending offset, because all we care about is whether or not we
     *   have an exact byte match between our suffix and the other string.  
     */
    retval->set_logical(len2 <= len
                        && memcmp(str + len - len2, str2, len2) == 0);

    /* handled */
    return TRUE;
}